

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O1

void __thiscall Simulator::push_real(Simulator *this,PCode *code)

{
  int iVar1;
  int iVar2;
  char *__nptr;
  pointer pSVar3;
  bool bVar4;
  string *str;
  Symbol *pSVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  Symbol symbol;
  StackSymbol local_f8;
  undefined1 local_b0 [40];
  vector<Symbol,_std::allocator<Symbol>_> local_88;
  pointer local_70;
  pointer local_68;
  double local_50;
  pointer local_48;
  
  str = &code->first_;
  bVar4 = Recognition::is_real(str);
  if (bVar4) {
    __nptr = (str->_M_dataplus)._M_p;
    str = (string *)__errno_location();
    iVar1 = *(int *)&(str->_M_dataplus)._M_p;
    *(int *)&(str->_M_dataplus)._M_p = 0;
    pSVar3 = (pointer)strtod(__nptr,(char **)&local_f8);
    if ((char *)CONCAT44(local_f8._4_4_,local_f8.type_) == __nptr) {
      uVar6 = std::__throw_invalid_argument("stod");
      StackSymbol::~StackSymbol((StackSymbol *)local_b0);
      _Unwind_Resume(uVar6);
    }
    iVar2 = *(int *)&(str->_M_dataplus)._M_p;
    if (iVar2 == 0) {
      *(int *)&(str->_M_dataplus)._M_p = iVar1;
    }
    else if (iVar2 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0011be28;
    }
    local_b0._0_4_ = kReal;
    local_b0._16_8_ = (undefined1 *)0x0;
    local_b0._24_8_ = 0;
    local_b0._32_8_ = (pointer)0x0;
    local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_70 = (pointer)0x0;
    local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
    _M_start = pSVar3;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,(StackSymbol *)local_b0);
    if (local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data
        ._M_finish != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
    puVar7 = (undefined1 *)local_b0._16_8_;
    if ((undefined1 *)local_b0._16_8_ == (undefined1 *)0x0) goto LAB_0011bed4;
  }
  else {
LAB_0011be28:
    pSVar5 = ScopeTree::resolve(&this->tree_,str);
    Symbol::Symbol((Symbol *)local_b0,pSVar5);
    local_f8.type_ = kReal;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.value_.real_value = local_50;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,&local_f8);
    if (local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48);
    }
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68);
    }
    std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_88);
    puVar7 = (undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
    if ((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) == local_b0 + 0x10) goto LAB_0011bed4;
  }
  operator_delete(puVar7);
LAB_0011bed4:
  this->eip_ = this->eip_ + 1;
  return;
}

Assistant:

void Simulator::push_real(const PCode &code) {
    if (Recognition::is_real(code.first())) {
        stack_.push_back(StackSymbol(std::stod(code.first())));
    } else {
        Symbol symbol = tree_.resolve(code.first());
        stack_.push_back(StackSymbol(symbol.real_value()));
    }
    inc_eip();
}